

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall
camp::FunctionNotFound::FunctionNotFound(FunctionNotFound *this,FunctionNotFound *param_1)

{
  FunctionNotFound *param_1_local;
  FunctionNotFound *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__FunctionNotFound_001fd508;
  return;
}

Assistant:

class CAMP_API FunctionNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested function
     * \param className Name of the owner metaclass
     */
    FunctionNotFound(const std::string& name, const std::string& className);
}